

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitileave.hpp
# Opt level: O1

ull_type bitmanip::detail::ileave_impl<unsigned_int,unsigned_int,unsigned_int,0ul,1ul,2ul>
                   (ulong param_1,uint param_2,uint param_3)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  ulong local_48 [3];
  uint64_t MASKS [5];
  
  local_48[0] = 0x9249249249249249;
  local_48[1] = 0x30c30c30c30c30c3;
  local_48[2] = 0xf00f00f00f00f00f;
  MASKS[0] = 0xff0000ff0000ff;
  MASKS[1] = 0xffff00000000ffff;
  param_1 = param_1 & 0xffffffff;
  lVar1 = 4;
  do {
    param_1 = (param_1 | param_1 << ((byte)(2 << ((byte)lVar1 & 0x1f)) & 0x3f)) & local_48[lVar1];
    bVar4 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar4);
  local_48[0] = 0x9249249249249249;
  local_48[1] = 0x30c30c30c30c30c3;
  local_48[2] = 0xf00f00f00f00f00f;
  MASKS[0] = 0xff0000ff0000ff;
  MASKS[1] = 0xffff00000000ffff;
  uVar3 = (ulong)param_2;
  lVar1 = 4;
  do {
    uVar3 = (uVar3 | uVar3 << ((byte)(2 << ((byte)lVar1 & 0x1f)) & 0x3f)) & local_48[lVar1];
    bVar4 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar4);
  local_48[0] = 0x9249249249249249;
  local_48[1] = 0x30c30c30c30c30c3;
  local_48[2] = 0xf00f00f00f00f00f;
  MASKS[0] = 0xff0000ff0000ff;
  MASKS[1] = 0xffff00000000ffff;
  uVar2 = (ulong)param_3;
  lVar1 = 4;
  do {
    uVar2 = (uVar2 | uVar2 << ((byte)(2 << ((byte)lVar1 & 0x1f)) & 0x3f)) & local_48[lVar1];
    bVar4 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar4);
  return param_1 << 2 | uVar3 * 2 | uVar2;
}

Assistant:

[[nodiscard]] constexpr auto ileave_impl(std::index_sequence<I...>, Uint... args) noexcept -> ull_type
{
    constexpr std::size_t max = sizeof...(I) - 1;
    return (ileaveZeros_const<max, max - I>(args) | ...);
}